

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

void __thiscall LTAircraft::CopyBulkData(LTAircraft *this,LTAPIBulkInfoTexts *pOut,size_t size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  string *psVar4;
  char *__s;
  FDStaticData stat;
  FDDynamicData dyn;
  string local_438;
  allocator<char> local_411;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  FDStaticData local_210;
  FDDynamicData local_78;
  
  if (0x107 < size) {
    LTFlightData::WaitForSafeCopyStat(&local_210,this->fd);
    LTFlightData::WaitForSafeCopyDyn(&local_78,this->fd,true);
    *(unsigned_long *)pOut = (this->fd->acKey).num;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,local_210.reg._M_dataplus._M_p,
               local_210.reg._M_dataplus._M_p + local_210.reg._M_string_length);
    strAtMost(&local_438,&local_270,7);
    _Var3._M_p = local_438._M_dataplus._M_p;
    paVar1 = &local_438.field_2;
    strncpy((char *)(pOut + 8),local_438._M_dataplus._M_p,7);
    pOut[0xf] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,local_210.acTypeIcao._M_dataplus._M_p,
               local_210.acTypeIcao._M_dataplus._M_p + local_210.acTypeIcao._M_string_length);
    strAtMost(&local_438,&local_290,7);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0x10),local_438._M_dataplus._M_p,7);
    pOut[0x17] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->pDoc8643->classification)._M_dataplus._M_p;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,pcVar2,
               pcVar2 + (this->pDoc8643->classification)._M_string_length);
    strAtMost(&local_438,&local_2b0,3);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0x18),local_438._M_dataplus._M_p,3);
    pOut[0x1b] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->pDoc8643->wtc)._M_dataplus._M_p;
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d0,pcVar2,pcVar2 + (this->pDoc8643->wtc)._M_string_length);
    strAtMost(&local_438,&local_2d0,3);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0x1c),local_438._M_dataplus._M_p,3);
    pOut[0x1f] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f0,local_210.opIcao._M_dataplus._M_p,
               local_210.opIcao._M_dataplus._M_p + local_210.opIcao._M_string_length);
    strAtMost(&local_438,&local_2f0,7);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0x20),local_438._M_dataplus._M_p,7);
    pOut[0x27] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310,local_210.man._M_dataplus._M_p,
               local_210.man._M_dataplus._M_p + local_210.man._M_string_length);
    strAtMost(&local_438,&local_310,0x27);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0x28),local_438._M_dataplus._M_p,0x27);
    pOut[0x4f] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,local_210.mdl._M_dataplus._M_p,
               local_210.mdl._M_dataplus._M_p + local_210.mdl._M_string_length);
    strAtMost(&local_438,&local_330,0x27);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0x50),local_438._M_dataplus._M_p,0x27);
    pOut[0x77] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_350,local_210.catDescr._M_dataplus._M_p,
               local_210.catDescr._M_dataplus._M_p + local_210.catDescr._M_string_length);
    strAtMost(&local_438,&local_350,0x27);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0x78),local_438._M_dataplus._M_p,0x27);
    pOut[0x9f] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,local_210.op._M_dataplus._M_p,
               local_210.op._M_dataplus._M_p + local_210.op._M_string_length);
    strAtMost(&local_438,&local_370,0x27);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0xa0),local_438._M_dataplus._M_p,0x27);
    pOut[199] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_390,local_210.call._M_dataplus._M_p,
               local_210.call._M_dataplus._M_p + local_210.call._M_string_length);
    strAtMost(&local_438,&local_390,7);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 200),local_438._M_dataplus._M_p,7);
    pOut[0xcf] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    LTFlightData::FDDynamicData::GetSquawk_abi_cxx11_(&local_230,&local_78);
    strAtMost(&local_438,&local_230,7);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0xd0),local_438._M_dataplus._M_p,7);
    pOut[0xd7] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b0,local_210.flight._M_dataplus._M_p,
               local_210.flight._M_dataplus._M_p + local_210.flight._M_string_length);
    strAtMost(&local_438,&local_3b0,7);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0xd8),local_438._M_dataplus._M_p,7);
    pOut[0xdf] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    psVar4 = local_210.stops.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_210.stops.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_210.stops.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar4 = &LTFlightData::FDStaticData::emptyStr_abi_cxx11_;
    }
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3d0,pcVar2,pcVar2 + psVar4->_M_string_length);
    strAtMost(&local_438,&local_3d0,7);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0xe0),local_438._M_dataplus._M_p,7);
    pOut[0xe7] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    if ((ulong)((long)local_210.stops.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_210.stops.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      psVar4 = &LTFlightData::FDStaticData::emptyStr_abi_cxx11_;
    }
    else {
      psVar4 = local_210.stops.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3f0,pcVar2,pcVar2 + psVar4->_M_string_length);
    strAtMost(&local_438,&local_3f0,7);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0xe8),local_438._M_dataplus._M_p,7);
    pOut[0xef] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if (local_78.pChannel == (LTChannel *)0x0) {
      __s = "-";
    }
    else {
      __s = (local_78.pChannel)->pszChName;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,__s,&local_411);
    strAtMost(&local_438,&local_250,0x17);
    _Var3._M_p = local_438._M_dataplus._M_p;
    strncpy((char *)(pOut + 0xf0),local_438._M_dataplus._M_p,0x17);
    pOut[0x107] = (LTAPIBulkInfoTexts)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if (size < 0x130) {
      if (0x11f < size) {
        psVar4 = XPMP2::Aircraft::GetModelName_abi_cxx11_(&this->super_Aircraft);
        strncpy((char *)(pOut + 0x108),(psVar4->_M_dataplus)._M_p,0x17);
        pOut[0x11f] = (LTAPIBulkInfoTexts)0x0;
      }
    }
    else {
      psVar4 = XPMP2::Aircraft::GetModelName_abi_cxx11_(&this->super_Aircraft);
      pcVar2 = (psVar4->_M_dataplus)._M_p;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_410,pcVar2,pcVar2 + psVar4->_M_string_length);
      strAtMost(&local_438,&local_410,0x27);
      strncpy((char *)(pOut + 0x108),local_438._M_dataplus._M_p,0x27);
      pOut[0x12f] = (LTAPIBulkInfoTexts)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != paVar1) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
    }
    LTFlightData::FDStaticData::~FDStaticData(&local_210);
  }
  return;
}

Assistant:

void LTAircraft::CopyBulkData (LTAPIAircraft::LTAPIBulkInfoTexts* pOut,
                               size_t size) const
{
    // If size isn't enough for original structure we bail:
    if (size < LTAPIBulkInfoTexts_v120)
        return;
    
    // Fill the output buffer one by one
    const LTFlightData::FDStaticData stat = fd.WaitForSafeCopyStat();
    const LTFlightData::FDDynamicData dyn = fd.WaitForSafeCopyDyn();
    pOut->keyNum = fd.key().num;
    STRCPY_ATMOST(pOut->registration,   stat.reg);
    // aircraft model/operator
    STRCPY_ATMOST(pOut->modelIcao,      stat.acTypeIcao);
    STRCPY_ATMOST(pOut->acClass,        pDoc8643->classification);
    STRCPY_ATMOST(pOut->wtc,            pDoc8643->wtc);
    STRCPY_ATMOST(pOut->opIcao,         stat.opIcao);
    STRCPY_ATMOST(pOut->man,            stat.man);
    STRCPY_ATMOST(pOut->model,          stat.mdl);
    STRCPY_ATMOST(pOut->catDescr,       stat.catDescr);
    STRCPY_ATMOST(pOut->op,             stat.op);
    // flight data
    STRCPY_ATMOST(pOut->callSign,       stat.call);
    STRCPY_ATMOST(pOut->squawk,         dyn.GetSquawk());
    STRCPY_ATMOST(pOut->flightNumber,   stat.flight);
    STRCPY_ATMOST(pOut->origin,         stat.origin());
    STRCPY_ATMOST(pOut->destination,    stat.dest());
    STRCPY_ATMOST(pOut->trackedBy,      dyn.pChannel ? dyn.pChannel->ChName() : "-");
    
    // v2.40 additions (cslModel field extended to 40 chars)
    if (size >= LTAPIBulkInfoTexts_v240) {
        STRCPY_ATMOST(pOut->cslModel, GetModelName());
    }
    // v1.22 additions (cslModel field had 24 chars only)
    else if (size >= LTAPIBulkInfoTexts_v122) {
        strncpy_s(pOut->cslModel, 24, GetModelName().c_str(), 23);
    }
}